

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_struct_member_matrix_stride_msl
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool packed;
  bool row_major;
  TypedID<(spirv_cross::Types)1> id;
  uint32_t uVar1;
  SPIRType *type_00;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  type_00 = get_physical_member_type(this,type,index);
  packed = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  id = TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
  row_major = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)id.id,index,DecorationRowMajor);
  uVar1 = get_declared_type_matrix_stride_msl(this,type_00,packed,row_major);
  return uVar1;
}

Assistant:

uint32_t CompilerMSL::get_declared_struct_member_matrix_stride_msl(const SPIRType &type, uint32_t index) const
{
	return get_declared_type_matrix_stride_msl(get_physical_member_type(type, index),
	                                           member_is_packed_physical_type(type, index),
	                                           has_member_decoration(type.self, index, DecorationRowMajor));
}